

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

char * inputSeq(void)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 *puVar4;
  char *__src;
  ulong uVar5;
  undefined8 uStack_390;
  undefined1 auStack_388 [8];
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  byte local_361;
  char *local_360;
  int local_354;
  int local_350;
  int i_1;
  int i;
  int len;
  unsigned_long __vla_expr0;
  uint local_338;
  int cntLines;
  ifstream local_328 [8];
  ifstream inFile;
  char *filename;
  char buffer [256];
  char *seq;
  
  uStack_390 = 0x102987;
  std::ifstream::ifstream(local_328);
  uStack_390 = 0x10299d;
  pcVar2 = catStrStr(inputAddress,"seq.txt");
  uStack_390 = 0x1029c7;
  local_360 = pcVar2;
  openFile(pcVar2,local_328);
  local_338 = 0;
  while( true ) {
    uStack_390 = 0x1029eb;
    local_361 = std::ios::eof();
    if (((local_361 ^ 0xff) & 1) == 0) break;
    uStack_390 = 0x102a19;
    std::istream::getline((char *)local_328,(long)&filename);
    local_338 = local_338 + 1;
  }
  local_338 = local_338 - 1;
  uStack_390 = 0x102a69;
  std::ifstream::close();
  uStack_390 = 0x102a7e;
  openFile(pcVar2,local_328);
  _i = (ulong)local_338;
  lVar1 = _i * -0x100;
  local_370 = auStack_388 + lVar1;
  i_1 = 0;
  __vla_expr0 = (unsigned_long)auStack_388;
  *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102ad0;
  std::istream::getline((char *)local_328,(long)&filename);
  for (local_350 = 0; local_350 < (int)(local_338 - 1); local_350 = local_350 + 1) {
    puVar4 = local_370 + (long)local_350 * 0x100;
    *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102b15;
    std::istream::getline((char *)local_328,(long)puVar4);
    pcVar2 = local_370 + (long)local_350 * 0x100;
    *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102b31;
    sVar3 = strlen(pcVar2);
    i_1 = i_1 + (int)sVar3;
  }
  uVar5 = (ulong)i_1;
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102b6f;
  pcVar2 = (char *)operator_new__(uVar5);
  local_378 = pcVar2;
  *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102b93;
  strcpy(pcVar2,"");
  for (local_354 = 0; local_354 < (int)(local_338 - 1); local_354 = local_354 + 1) {
    __src = local_370 + (long)local_354 * 0x100;
    *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102bce;
    strcat(pcVar2,__src);
  }
  *(undefined8 *)(auStack_388 + lVar1 + -8) = 0x102beb;
  std::ifstream::close();
  local_380 = pcVar2;
  *(undefined8 *)(__vla_expr0 - 8) = 0x102c0e;
  std::ifstream::~ifstream(local_328);
  return local_380;
}

Assistant:

char * inputSeq(){
    // read in the sequence
    char *seq;
    char buffer[256];
    char *filename;
    ifstream inFile;
    filename = catStrStr(inputAddress,"seq.txt");
    openFile(filename, inFile);
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    inFile.close();

    openFile(filename, inFile);
    char tmp[cntLines][256];
    int len=0;
    inFile.getline(buffer, 256);                    //  the first line is not needed
    for (int i=0; i<cntLines-1; i++) {
        inFile.getline(tmp[i], 256);
        len += strlen(tmp[i]);
    }

    seq = new char [len];
    strcpy(seq, "");
    for (int i=0; i<cntLines-1; i++)  strcat(seq, tmp[i]);
    inFile.close();
    return seq;

}